

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

Var __thiscall
Js::TypedArrayBase::FindMinOrMax<char,false>
          (TypedArrayBase *this,ScriptContext *scriptContext,bool findMax)

{
  uchar uVar1;
  uint uVar2;
  Type puVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  Var pvVar8;
  ulong uVar9;
  ulong uVar10;
  uchar uVar11;
  
  puVar3 = this->buffer;
  uVar10 = (ulong)(this->super_ArrayBufferParent).super_ArrayObject.length;
  uVar2 = this->byteOffset;
  uVar6 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if (uVar6 <= uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9e8,
                                "(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())",
                                "sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()");
    if (!bVar5) {
LAB_00d7f47a:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  uVar11 = *puVar3;
  if (uVar10 != 0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar9 = 1;
    do {
      uVar2 = this->byteOffset;
      uVar6 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x71])();
      if ((ulong)uVar6 < uVar2 + uVar9) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                    ,0x9ec,
                                    "((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                    ,
                                    "(i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                   );
        if (!bVar5) goto LAB_00d7f47a;
        *puVar7 = 0;
      }
      uVar1 = puVar3[uVar9 - 1];
      if (findMax) {
        if ((char)uVar11 < (char)uVar1) {
LAB_00d7f441:
          uVar11 = uVar1;
        }
      }
      else if ((char)uVar1 < (char)uVar11) goto LAB_00d7f441;
      bVar5 = uVar9 != uVar10;
      uVar9 = uVar9 + 1;
    } while (bVar5);
  }
  pvVar8 = JavascriptNumber::ToVarNoCheck((double)(int)(char)uVar11,scriptContext);
  return pvVar8;
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        T* typedBuffer = (T*)this->buffer;
        uint len = this->GetLength();

        Assert(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        T currentRes = typedBuffer[0];
        for (uint i = 0; i < len; i++)
        {
            Assert((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            T compare = typedBuffer[i];
            if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
            if (findMax ? currentRes < compare : currentRes > compare ||
                (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
            {
                currentRes = compare;
            }
        }
        return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
    }